

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightlist.h
# Opt level: O3

void __thiscall
Common::lightlist<ICM::Object*>::lightlist<ICM::Object*const*>
          (lightlist<ICM::Object*> *this,Object **begin,Object **end)

{
  void *pvVar1;
  
  *(long *)this = (long)end - (long)begin >> 3;
  pvVar1 = malloc((long)end - (long)begin);
  *(void **)(this + 8) = pvVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ICM::Object**,void(*)(ICM::Object**),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x10),pvVar1,
             Memory::free<ICM::Object*>);
  if ((long)end - (long)begin != 0) {
    memmove(*(void **)(this + 8),begin,(long)end - (long)begin);
    return;
  }
  return;
}

Assistant:

lightlist(Iter begin, Iter end)
		: lightlist(static_cast<size_t>(end - begin)) {
		std::copy(begin, end, _PointerIterator(_data.get()));
	}